

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  Value *pVVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  ulong uVar6;
  pointer *ppbVar7;
  reference value;
  undefined1 local_7c8 [8];
  cmGeneratedFileStream tdif;
  string tdin;
  anon_class_8_1_8991fb9c local_538;
  undefined1 local_530 [8];
  cmDyndepGeneratorCallbacks cb;
  string *l_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  Value *local_480;
  Value *tdi_forward_modules_from_target_dirs;
  reference local_450;
  string *l;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  LinkedTargetDirs linked_directories;
  Value *tdi_linked_target_dirs;
  reference local_3a8;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value *tdi_include_dirs;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  allocator<char> local_299;
  string local_298;
  Value local_278;
  allocator<char> local_249;
  string local_248;
  Value local_228;
  Value local_200;
  string local_1d8;
  string local_1b8 [32];
  string local_198;
  undefined1 local_178 [8];
  string mod_dir;
  Value local_138;
  string local_110;
  Value local_f0;
  string local_c8;
  Value local_a8;
  Value local_70;
  undefined1 local_48 [8];
  Value tdi;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  tdi.limit_ = (ptrdiff_t)config;
  Json::Value::Value((Value *)local_48,objectValue);
  Json::Value::Value(&local_70,lang);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"language");
  Json::Value::operator=(pVVar3,&local_70);
  Json::Value::~Value(&local_70);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&local_c8,(char (*) [7])0x11240fa,lang,(char (*) [13])0x11292b5);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_c8);
  Json::Value::Value(&local_a8,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"compiler-id");
  Json::Value::operator=(pVVar3,&local_a8);
  Json::Value::~Value(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&local_110,(char (*) [7])0x11240fa,lang,(char (*) [13])0x1119efd);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
  Json::Value::Value(&local_f0,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"compiler-simulate-id");
  Json::Value::operator=(pVVar3,&local_f0);
  Json::Value::~Value(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[27]>
            ((string *)((long)&mod_dir.field_2 + 8),(char (*) [7])0x11240fa,lang,
             (char (*) [27])"_COMPILER_FRONTEND_VARIANT");
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)((long)&mod_dir.field_2 + 8));
  Json::Value::Value(&local_138,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"compiler-frontend-variant");
  Json::Value::operator=(pVVar3,&local_138);
  Json::Value::~Value(&local_138);
  std::__cxx11::string::~string((string *)(mod_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_178);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory(&local_198,this_00,psVar4);
    std::__cxx11::string::operator=((string *)local_178,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    bVar2 = std::operator==(lang,"CXX");
    if (bVar2) {
      pcVar5 = GetGlobalGenerator(this);
      cmsys::SystemTools::CollapseFullPath
                (&local_1d8,
                 &((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
      (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x18])(local_1b8,pcVar5,&local_1d8,tdi.limit_);
      std::__cxx11::string::operator=((string *)local_178,local_1b8);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    std::__cxx11::string::operator=((string *)local_178,(string *)psVar4);
  }
  Json::Value::Value(&local_200,(String *)local_178);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"module-dir");
  Json::Value::operator=(pVVar3,&local_200);
  Json::Value::~Value(&local_200);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CMAKE_Fortran_SUBMODULE_SEP",&local_249);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_248);
    Json::Value::Value(&local_228,psVar4);
    pVVar3 = Json::Value::operator[]((Value *)local_48,"submodule-sep");
    Json::Value::operator=(pVVar3,&local_228);
    Json::Value::~Value(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"CMAKE_Fortran_SUBMODULE_EXT",&local_299);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_298);
    Json::Value::Value(&local_278,psVar4);
    pVVar3 = Json::Value::operator[]((Value *)local_48,"submodule-ext");
    Json::Value::operator=(pVVar3,&local_278);
    Json::Value::~Value(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
  }
  else {
    std::operator==(lang,"CXX");
  }
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_2c8,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"dir-cur-bld");
  Json::Value::operator=(pVVar3,&local_2c8);
  Json::Value::~Value(&local_2c8);
  psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_2f0,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"dir-cur-src");
  Json::Value::operator=(pVVar3,&local_2f0);
  Json::Value::~Value(&local_2f0);
  psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_318,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"dir-top-bld");
  Json::Value::operator=(pVVar3,&local_318);
  Json::Value::~Value(&local_318);
  psVar4 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdi_include_dirs,psVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"dir-top-src");
  Json::Value::operator=(pVVar3,(Value *)&tdi_include_dirs);
  Json::Value::~Value((Value *)&tdi_include_dirs);
  Json::Value::Value((Value *)&includes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"include-dirs");
  ppbVar7 = &includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)ppbVar7);
  Json::Value::~Value((Value *)ppbVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(this->super_cmCommonTargetGenerator).GeneratorTarget,lang,
             (string *)tdi.limit_);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i), bVar2) {
    local_3a8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    psVar4 = ConvertToNinjaPath(this,local_3a8);
    Json::Value::Value((Value *)&tdi_linked_target_dirs,psVar4);
    Json::Value::append(pVVar3,(Value *)&tdi_linked_target_dirs);
    Json::Value::~Value((Value *)&tdi_linked_target_dirs);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&linked_directories.Forward.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"linked-target-dirs");
  ppbVar7 = &linked_directories.Forward.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)ppbVar7);
  Json::Value::~Value((Value *)ppbVar7);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((LinkedTargetDirs *)&__range1_1,&this->super_cmCommonTargetGenerator,lang,
             (string *)tdi.limit_);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&l), bVar2) {
    local_450 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    Json::Value::Value((Value *)&tdi_forward_modules_from_target_dirs,local_450);
    Json::Value::append(pVVar3,(Value *)&tdi_forward_modules_from_target_dirs);
    Json::Value::~Value((Value *)&tdi_forward_modules_from_target_dirs);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  Json::Value::Value((Value *)&__range1_2,arrayValue);
  pVVar3 = Json::Value::operator[]((Value *)local_48,"forward-modules-from-target-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)&__range1_2);
  Json::Value::~Value((Value *)&__range1_2);
  ppbVar7 = &linked_directories.Direct.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_480 = pVVar3;
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppbVar7);
  l_1 = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ppbVar7);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&l_1), bVar2) {
    value = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_2);
    pVVar3 = local_480;
    Json::Value::Value((Value *)&cb.BmiFilePath._M_invoker,value);
    Json::Value::append(pVVar3,(Value *)&cb.BmiFilePath._M_invoker);
    Json::Value::~Value((Value *)&cb.BmiFilePath._M_invoker);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  cmDyndepGeneratorCallbacks::cmDyndepGeneratorCallbacks((cmDyndepGeneratorCallbacks *)local_530);
  local_538.this = this;
  std::function<std::__cxx11::string(cmSourceFile_const*,std::__cxx11::string_const&)>::operator=
            ((function<std::__cxx11::string(cmSourceFile_const*,std::__cxx11::string_const&)> *)
             local_530,&local_538);
  tdin.field_2._8_8_ = this;
  std::function<std::__cxx11::string(cmSourceFile_const*,std::__cxx11::string_const&)>::operator=
            ((function<std::__cxx11::string(cmSourceFile_const*,std::__cxx11::string_const&)> *)
             &cb.ObjectFilePath._M_invoker,(anon_class_8_1_8991fb9c *)((long)&tdin.field_2 + 8));
  cmDyndepCollation::AddCollationInformation
            ((Value *)local_48,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (string *)tdi.limit_,(cmDyndepGeneratorCallbacks *)local_530);
  GetTargetDependInfoPath((string *)&tdif.field_0x260,this,lang,(string *)tdi.limit_);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_7c8,(string *)&tdif.field_0x260,false,None);
  Json::operator<<((OStream *)local_7c8,(Value *)local_48);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_7c8);
  std::__cxx11::string::~string((string *)&tdif.field_0x260);
  cmDyndepGeneratorCallbacks::~cmDyndepGeneratorCallbacks((cmDyndepGeneratorCallbacks *)local_530);
  cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs((LinkedTargetDirs *)&__range1_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string((string *)local_178);
  Json::Value::~Value((Value *)local_48);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));
  tdi["compiler-simulate-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));
  tdi["compiler-frontend-variant"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_FRONTEND_VARIANT"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  auto const linked_directories =
    this->GetLinkedTargetDirectories(lang, config);
  for (std::string const& l : linked_directories.Direct) {
    tdi_linked_target_dirs.append(l);
  }

  Json::Value& tdi_forward_modules_from_target_dirs =
    tdi["forward-modules-from-target-dirs"] = Json::arrayValue;
  for (std::string const& l : linked_directories.Forward) {
    tdi_forward_modules_from_target_dirs.append(l);
  }

  cmDyndepGeneratorCallbacks cb;
  cb.ObjectFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetObjectFilePath(sf, cnf);
  };
  cb.BmiFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetBmiFilePath(sf, cnf);
  };

#if !defined(CMAKE_BOOTSTRAP)
  cmDyndepCollation::AddCollationInformation(tdi, this->GeneratorTarget,
                                             config, cb);
#endif

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}